

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *pOVar1;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *attachments_1;
  DestructionOrderRecorder *pDVar2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> OVar3;
  bool local_c2;
  bool local_c1;
  bool local_c0;
  bool local_bf;
  bool local_be;
  bool local_bd;
  bool local_bc;
  bool local_bb;
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> combined;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *ptr;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> arr;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> builder;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> obj3;
  undefined1 local_40 [8];
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> obj2;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> obj1;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  uint counter;
  TestCase399 *this_local;
  
  destroyed2 = 0;
  destroyed3 = 0;
  obj1.ptr._4_4_ = 0;
  obj1.ptr._0_4_ = 0;
  _destroyed1 = this;
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)&obj2.ptr,&destroyed2,&destroyed3);
  heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
            ((kj *)local_40,&destroyed2,(uint *)((long)&obj1.ptr + 4));
  OVar3 = heap<kj::(anonymous_namespace)::DestructionOrderRecorder,unsigned_int&,unsigned_int&>
                    ((kj *)&builder.disposer,&destroyed2,(uint *)&obj1.ptr);
  heapArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
            ((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &arr.disposer,(kj *)0x1,(size_t)OVar3.ptr);
  pOVar1 = mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&obj2.ptr);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>::
  add<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
            ((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>> *)
             &arr.disposer,pOVar1);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::finish
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)&ptr,
             (ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &arr.disposer);
  combined.disposer =
       (ArrayDisposer *)
       Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::begin
                 ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)&ptr);
  pOVar1 = mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)local_40);
  attachments_1 =
       mv<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
                 ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&builder.disposer);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &_kj_shouldLog_7,&ptr,pOVar1,attachments_1);
  pOVar1 = Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::begin
                     ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
                      &_kj_shouldLog_7);
  if (pOVar1 != (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)combined.disposer) {
    _kj_shouldLog_8 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_8 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a0,ERROR,"\"failed: expected \" \"combined.begin() == ptr\"",
                 (char (*) [41])"failed: expected combined.begin() == ptr");
      _kj_shouldLog_8 = false;
    }
  }
  pDVar2 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::get
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&obj2.ptr);
  if (pDVar2 != (DestructionOrderRecorder *)0x0) {
    _kj_shouldLog_9 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_9 != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a2,ERROR,"\"failed: expected \" \"obj1.get() == nullptr\"",
                 (char (*) [39])"failed: expected obj1.get() == nullptr");
      _kj_shouldLog_9 = false;
    }
  }
  pDVar2 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::get
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)local_40);
  if (pDVar2 != (DestructionOrderRecorder *)0x0) {
    local_bb = _::Debug::shouldLog(ERROR);
    while (local_bb != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a3,ERROR,"\"failed: expected \" \"obj2.get() == nullptr\"",
                 (char (*) [39])"failed: expected obj2.get() == nullptr");
      local_bb = false;
    }
  }
  pDVar2 = Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::get
                     ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&builder.disposer)
  ;
  if (pDVar2 != (DestructionOrderRecorder *)0x0) {
    local_bc = _::Debug::shouldLog(ERROR);
    while (local_bc != false) {
      _::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a4,ERROR,"\"failed: expected \" \"obj3.get() == nullptr\"",
                 (char (*) [39])"failed: expected obj3.get() == nullptr");
      local_bc = false;
    }
  }
  if (destroyed3 != 0) {
    local_bd = _::Debug::shouldLog(ERROR);
    while (local_bd != false) {
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a5,ERROR,"\"failed: expected \" \"destroyed1 == 0\"",
                 (char (*) [33])"failed: expected destroyed1 == 0");
      local_bd = false;
    }
  }
  if (obj1.ptr._4_4_ != 0) {
    local_be = _::Debug::shouldLog(ERROR);
    while (local_be != false) {
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a6,ERROR,"\"failed: expected \" \"destroyed2 == 0\"",
                 (char (*) [33])"failed: expected destroyed2 == 0");
      local_be = false;
    }
  }
  if ((int)obj1.ptr != 0) {
    local_bf = _::Debug::shouldLog(ERROR);
    while (local_bf != false) {
      _::Debug::log<char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1a7,ERROR,"\"failed: expected \" \"destroyed3 == 0\"",
                 (char (*) [33])"failed: expected destroyed3 == 0");
      local_bf = false;
    }
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::operator=
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &_kj_shouldLog_7,(void *)0x0);
  if (destroyed3 != 1) {
    local_c0 = _::Debug::shouldLog(ERROR);
    while (local_c0 != false) {
      _::Debug::log<char_const(&)[33],unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1ab,ERROR,"\"failed: expected \" \"destroyed1 == 1\", destroyed1",
                 (char (*) [33])"failed: expected destroyed1 == 1",&destroyed3);
      local_c0 = false;
    }
  }
  if (obj1.ptr._4_4_ != 2) {
    local_c1 = _::Debug::shouldLog(ERROR);
    while (local_c1 != false) {
      _::Debug::log<char_const(&)[33],unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1ac,ERROR,"\"failed: expected \" \"destroyed2 == 2\", destroyed2",
                 (char (*) [33])"failed: expected destroyed2 == 2",(uint *)((long)&obj1.ptr + 4));
      local_c1 = false;
    }
  }
  if ((int)obj1.ptr != 3) {
    local_c2 = _::Debug::shouldLog(ERROR);
    while (local_c2 != false) {
      _::Debug::log<char_const(&)[33],unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x1ad,ERROR,"\"failed: expected \" \"destroyed3 == 3\", destroyed3",
                 (char (*) [33])"failed: expected destroyed3 == 3",(uint *)&obj1.ptr);
      local_c2 = false;
    }
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &_kj_shouldLog_7);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)&ptr);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)
             &arr.disposer);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&builder.disposer);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)local_40);
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder>::~Own
            ((Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)&obj2.ptr);
  return;
}

Assistant:

TEST(Array, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}